

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O2

string * __thiscall
t_dart_generator::function_signature_abi_cxx11_
          (string *__return_storage_ptr__,t_dart_generator *this,t_function *tfunction)

{
  int iVar1;
  t_dart_generator *this_00;
  string returntype;
  string arguments;
  string sStack_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  string local_38;
  
  argument_list_abi_cxx11_(&local_58,this,tfunction->arglist_);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  iVar1 = (*(tfunction->returntype_->super_t_doc)._vptr_t_doc[4])();
  if ((char)iVar1 == '\0') {
    type_name_abi_cxx11_(&sStack_118,this,tfunction->returntype_);
    std::operator+(&local_f8,"Future<",&sStack_118);
    std::operator+(&local_d8,&local_f8,">");
    std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&sStack_118);
  }
  else {
    std::__cxx11::string::assign((char *)&local_b8);
  }
  std::operator+(&local_78,&local_b8," ");
  this_00 = (t_dart_generator *)&tfunction->name_;
  std::__cxx11::string::string((string *)&local_98,(string *)this_00);
  get_member_name(&local_38,this_00,&local_98);
  std::operator+(&sStack_118,&local_78,&local_38);
  std::operator+(&local_f8,&sStack_118,"(");
  std::operator+(&local_d8,&local_f8,&local_58);
  std::operator+(__return_storage_ptr__,&local_d8,")");
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&sStack_118);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

string t_dart_generator::function_signature(t_function* tfunction) {
  std::string arguments = argument_list(tfunction->get_arglist());

  std::string returntype;
  if (tfunction->get_returntype()->is_void()) {
    returntype = "Future";
  } else {
    returntype = "Future<" + type_name(tfunction->get_returntype()) + ">";
  }

  std::string result = returntype + " " + get_member_name(tfunction->get_name()) +
                       "(" + arguments + ")";
  return result;
}